

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

optional<std::pair<CPubKey,_int>_> * __thiscall
miniscript::internal::ParseKeyEnd<CPubKey,(anonymous_namespace)::KeyConverter>
          (optional<std::pair<CPubKey,_int>_> *__return_storage_ptr__,internal *this,
          Span<const_char> in,KeyConverter *ctx)

{
  uint uVar1;
  char *last;
  long in_FS_OFFSET;
  Span<const_char> sp;
  optional<CPubKey> key;
  optional<CPubKey> local_6a;
  long local_28;
  
  last = (char *)in.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 0x29;
  sp.m_data = in.m_data;
  uVar1 = FindNextChar(this,sp,(char)in.m_size);
  if ((int)uVar1 < 1) {
    (__return_storage_ptr__->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload.
    super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_engaged = false;
  }
  else {
    (anonymous_namespace)::KeyConverter::FromString<char_const*>
              (&local_6a,this,(char *)(this + uVar1),last);
    if (local_6a.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_engaged == true) {
      memcpy(__return_storage_ptr__,&local_6a,0x41);
      (__return_storage_ptr__->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload
      .super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_payload._M_value.second = uVar1;
    }
    (__return_storage_ptr__->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload.
    super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_engaged =
         local_6a.super__Optional_base<CPubKey,_true,_true>._M_payload.
         super__Optional_payload_base<CPubKey>._M_engaged == true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<Key, int>> ParseKeyEnd(Span<const char> in, const Ctx& ctx)
{
    int key_size = FindNextChar(in, ')');
    if (key_size < 1) return {};
    auto key = ctx.FromString(in.begin(), in.begin() + key_size);
    if (!key) return {};
    return {{std::move(*key), key_size}};
}